

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::FieldMaskUtil::CamelCaseToSnakeCase
          (FieldMaskUtil *this,StringPiece input,string *output)

{
  long i;
  char cVar1;
  bool bVar2;
  long i_00;
  undefined1 local_38 [8];
  StringPiece input_local;
  
  input_local.ptr_ = input.ptr_;
  ((undefined8 *)input.length_)[1] = 0;
  **(undefined1 **)input.length_ = 0;
  bVar2 = (long)input_local.ptr_ < 1;
  if ((0 < (long)input_local.ptr_) &&
     (local_38 = (undefined1  [8])this, cVar1 = StringPiece::operator[]((StringPiece *)local_38,0),
     cVar1 != '_')) {
    i_00 = 1;
    do {
      i = i_00 + -1;
      cVar1 = StringPiece::operator[]((StringPiece *)local_38,i);
      if ((cVar1 < 'A') || (cVar1 = StringPiece::operator[]((StringPiece *)local_38,i), 'Z' < cVar1)
         ) {
        StringPiece::operator[]((StringPiece *)local_38,i);
      }
      else {
        std::__cxx11::string::push_back((char)input.length_);
        StringPiece::operator[]((StringPiece *)local_38,i);
      }
      std::__cxx11::string::push_back((char)input.length_);
      bVar2 = (long)input_local.ptr_ <= i_00;
      if ((long)input_local.ptr_ <= i_00) {
        return bVar2;
      }
      cVar1 = StringPiece::operator[]((StringPiece *)local_38,i_00);
      i_00 = i_00 + 1;
    } while (cVar1 != '_');
  }
  return bVar2;
}

Assistant:

bool FieldMaskUtil::CamelCaseToSnakeCase(StringPiece input,
                                         std::string* output) {
  output->clear();
  for (int i = 0; i < input.size(); ++i) {
    if (input[i] == '_') {
      // The field name must not contain "_"s.
      return false;
    }
    if (input[i] >= 'A' && input[i] <= 'Z') {
      output->push_back('_');
      output->push_back(input[i] + 'a' - 'A');
    } else {
      output->push_back(input[i]);
    }
  }
  return true;
}